

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3cgen.cpp
# Opt level: O0

void __thiscall WasmCGen::Loop(WasmCGen *this)

{
  reference pvVar1;
  WasmCGen *this_local;
  
  printf("/*%s*/\n","Loop");
  Block(this);
  pvVar1 = std::stack<w3Label,_std::deque<w3Label,_std::allocator<w3Label>_>_>::top
                     (&(this->super_w3SourceGen).labels);
  pvVar1->arity = 0;
  return;
}

Assistant:

CGEN (Loop)
{
    printf ("/*%s*/\n", __func__);
    Block ();
    labels.top ().arity = 0;
}